

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O3

bool __thiscall
Matrix::AddColumn(Matrix *this,int first_column,int second_column,Fraction coefficient)

{
  long lVar1;
  bool bVar2;
  int row;
  long lVar3;
  long lVar4;
  bool local_4c;
  Fraction local_48;
  long local_40;
  Fraction local_38;
  
  local_4c = false;
  local_38 = coefficient;
  Fraction::Fraction(&local_48,0);
  bVar2 = operator==(&local_38,&local_48);
  if ((!bVar2) && (0 < this->n_)) {
    lVar4 = 0;
    local_40 = (long)first_column << 3;
    lVar3 = 0;
    local_4c = false;
    do {
      lVar1 = *(long *)((long)&(((this->elements_).
                                 super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<Fraction,_std::allocator<Fraction>_>)._M_impl.
                               super__Vector_impl_data + lVar4);
      Fraction::Fraction(&local_48,0);
      bVar2 = operator!=((Fraction *)(lVar1 + (long)second_column * 8),&local_48);
      if (bVar2) {
        local_48 = operator*(&local_38,
                             (Fraction *)
                             (*(long *)((long)&(((this->elements_).
                                                 super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->
                                               super__Vector_base<Fraction,_std::allocator<Fraction>_>
                                               )._M_impl.super__Vector_impl_data + lVar4) +
                             (long)second_column * 8));
        Fraction::operator+=
                  ((Fraction *)
                   (*(long *)((long)&(((this->elements_).
                                       super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super__Vector_base<Fraction,_std::allocator<Fraction>_>).
                                     _M_impl.super__Vector_impl_data + lVar4) + local_40),&local_48)
        ;
        local_4c = true;
      }
      lVar3 = lVar3 + 1;
      lVar4 = lVar4 + 0x18;
    } while (lVar3 < this->n_);
  }
  return local_4c;
}

Assistant:

bool Matrix::AddColumn(int first_column, int second_column, Fraction coefficient) {
  if (coefficient == 0) {
    return false;
  }

  bool result = false;
  for (int row = 0; row < n_; ++row) {
    if (elements_[row][second_column] != 0) {
      result = true;
      elements_[row][first_column] += coefficient * elements_[row][second_column];
    }
  }

  return result;
}